

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char,kj::String,char>
          (StringTree *__return_storage_ptr__,kj *this,char *params,String *params_1,char *params_2)

{
  undefined1 local_42;
  undefined1 local_41 [57];
  
  local_41[0] = *this;
  local_41._17_8_ = *(undefined8 *)(params + 8);
  local_41._1_8_ = 0;
  if (local_41._17_8_ != 0) {
    local_41._1_8_ = local_41._17_8_ - 1;
  }
  local_41._9_8_ = *(undefined8 *)params;
  local_41._25_8_ = *(undefined8 *)(params + 0x10);
  params[0] = '\0';
  params[1] = '\0';
  params[2] = '\0';
  params[3] = '\0';
  params[4] = '\0';
  params[5] = '\0';
  params[6] = '\0';
  params[7] = '\0';
  params[8] = '\0';
  params[9] = '\0';
  params[10] = '\0';
  params[0xb] = '\0';
  params[0xc] = '\0';
  params[0xd] = '\0';
  params[0xe] = '\0';
  params[0xf] = '\0';
  local_41._49_8_ = (ArrayDisposer *)0x0;
  local_41._33_8_ = (Branch *)0x0;
  local_41._41_8_ = 0;
  local_42 = *(undefined1 *)&(params_1->content).ptr;
  StringTree::concat<kj::FixedArray<char,1ul>,kj::StringTree,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(StringTree *)local_41,
             (FixedArray<char,_1UL> *)((long)local_41 + 1),(StringTree *)&local_42,
             (FixedArray<char,_1UL> *)local_41._9_8_);
  StringTree::~StringTree((StringTree *)((long)local_41 + 1));
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}